

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

char * __thiscall bloaty::Regex::_InternalParse(Regex *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  char *field_name;
  uint32 tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
    if (bVar1) {
      return local_40;
    }
    local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
    if (local_34 >> 3 == 2) {
      if ((char)local_34 == '\x12') {
        s = _internal_mutable_replacement_abi_cxx11_(this);
        field_name = "bloaty.Regex.replacement";
        goto LAB_00189ce9;
      }
LAB_00189cf0:
      if ((local_34 == 0) || ((local_34 & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
        return local_40;
      }
      local_40 = google::protobuf::internal::UnknownFieldParse
                           (local_34,&this->_internal_metadata_,local_40,ctx);
    }
    else {
      if ((local_34 >> 3 != 1) || ((char)local_34 != '\n')) goto LAB_00189cf0;
      s = _internal_mutable_pattern_abi_cxx11_(this);
      field_name = "bloaty.Regex.pattern";
LAB_00189ce9:
      local_40 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                           (s,local_40,ctx,field_name);
    }
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Regex::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string pattern = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_pattern(), ptr, ctx, "bloaty.Regex.pattern");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string replacement = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_replacement(), ptr, ctx, "bloaty.Regex.replacement");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}